

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

expression_ptr __thiscall
mjs::parser::
make_expression<mjs::regexp_literal_expression,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
          (parser *this,basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *args,
          basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *args_1)

{
  position_stack_node *this_00;
  wstring_view pattern;
  regexp_literal_expression *this_01;
  wstring_view *in_RCX;
  source_extend sStack_48;
  
  this_00 = (position_stack_node *)args[6]._M_str;
  if (this_00 != (position_stack_node *)0x0) {
    this_01 = (regexp_literal_expression *)operator_new(0x50);
    position_stack_node::extend(&sStack_48,this_00);
    pattern._M_len = args_1->_M_len;
    pattern._M_str = args_1->_M_str;
    regexp_literal_expression::regexp_literal_expression(this_01,&sStack_48,pattern,*in_RCX);
    (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this_01;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sStack_48.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
           (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
  }
  __assert_fail("expression_pos_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp",
                0x13d,
                "expression_ptr mjs::parser::make_expression(Args &&...) [T = mjs::regexp_literal_expression, Args = <std::basic_string_view<wchar_t>, std::basic_string_view<wchar_t>>]"
               );
}

Assistant:

expression_ptr make_expression(Args&&... args) {
        assert(expression_pos_);
        auto e = expression_ptr{new T{expression_pos_->extend(), std::forward<Args>(args)...}};
#ifdef PARSER_DEBUG
        std::wcout << e->extend() << " Producting: " << *e << "\n";
#endif
        return e;
    }